

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void kratos::IterVar::fix_width(Var **var,uint32_t target_width)

{
  Const *this;
  InternalException *this_00;
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  
  while (this = (Const *)*var, this != (Const *)0x0) {
    switch((this->super_Var).type_) {
    case Expression:
      fix_width((Var **)&this->hex_value_,target_width);
      var = (Var **)&(this->hex_value_)._M_string_length;
      break;
    default:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      (**(code **)(*(long *)*var + 0x100))(local_68);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb8,"Unable to fix width for ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      InternalException::InternalException(this_00,(string *)&stack0xffffffffffffffb8);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    case ConstValue:
    case Parameter:
      Const::set_width(this,target_width);
      return;
    case Iter:
      Var::cast((Var *)local_68,(VarCastType)this);
      Var::as<kratos::VarCasted>((Var *)&stack0xffffffffffffffb8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
      VarCasted::set_target_width((VarCasted *)local_48._M_p,target_width);
      *var = (Var *)local_48._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
      return;
    }
  }
  return;
}

Assistant:

void IterVar::fix_width(Var *&var, uint32_t target_width) {
    if (var && var->type() == VarType::Iter) {
        auto *iter = reinterpret_cast<IterVar *>(var);
        auto casted = iter->cast(VarCastType::Resize)->as<VarCasted>();
        casted->set_target_width(target_width);
        var = casted.get();
    } else if (var && var->type() == VarType::ConstValue) {
        auto *c = reinterpret_cast<Const *>(var);
        c->set_width(target_width);
    } else if (var && var->type() == VarType::Parameter) {
        auto *c = reinterpret_cast<Param *>(var);
        c->set_width(target_width);
    } else if (var && var->type() == VarType::Expression) {
        auto *expr = reinterpret_cast<Expr *>(var);
        fix_width(expr->left, target_width);
        fix_width(expr->right, target_width);
    } else {
        // LCOV_EXCL_START
        if (var) {
            throw InternalException("Unable to fix width for " + var->handle_name());
        }
        // LCOV_EXCL_STOP
    }
}